

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perm.c
# Opt level: O1

void perm_rand(int n,int *arr)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar2 = _DAT_00104710;
  if (0 < n) {
    lVar4 = (ulong)(uint)n - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00104710;
    auVar7 = _DAT_00104700;
    do {
      auVar8 = auVar7 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        arr[uVar5] = (int)uVar5;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        arr[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar5);
  }
  if (1 < n) {
    uVar1 = n - 1;
    uVar5 = 0;
    do {
      iVar3 = rand();
      lVar4 = (long)(iVar3 % n) + uVar5;
      iVar3 = arr[lVar4];
      arr[lVar4] = arr[uVar5];
      arr[uVar5] = iVar3;
      uVar5 = uVar5 + 1;
      n = n + -1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void perm_rand(int n, int* arr)
{
	perm_ident(n, arr);
	for (int i = 0; i < n - 1; ++i) {
		int j = i + rand() % (n - i);
		const int sw = arr[j];
		arr[j] = arr[i];
		arr[i] = sw;
	}
}